

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSharedPPData.cpp
# Opt level: O3

void __thiscall
SharedPPDataTest_testPODProperty_Test::TestBody(SharedPPDataTest_testPODProperty_Test *this)

{
  map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
  *pmVar1;
  bool bVar2;
  Base *pBVar3;
  Base **ppBVar4;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_;
  int o;
  AssertionResult gtest_ar;
  float m;
  AssertHelper local_68;
  Message local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  int local_44;
  undefined1 local_40 [36];
  float local_1c;
  
  pmVar1 = &((this->super_SharedPPDataTest).shared)->pmap;
  pBVar3 = (Base *)operator_new(0x10);
  pBVar3->_vptr_Base = (_func_int **)&PTR__Base_008dc0f0;
  *(undefined4 *)&pBVar3[1]._vptr_Base = 5;
  SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>(pmVar1,"test",pBVar3,(bool *)0x0);
  local_44 = 0;
  local_40._0_8_ = (Base *)0x0;
  ppBVar4 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                      (&((this->super_SharedPPDataTest).shared)->pmap,"test",(Base **)local_40);
  if (*ppBVar4 == (Base *)0x0) {
    local_60.ss_.ptr_._0_4_ = (uint)local_60.ss_.ptr_._1_3_ << 8;
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_60,
               (AssertionResult *)"shared->GetProperty(\"test\",o)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x4f,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((Base *)local_40._0_8_ != (Base *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
    if (((local_68.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_68.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  else {
    local_44 = *(int *)&(*ppBVar4)[1]._vptr_Base;
    local_60.ss_.ptr_._0_4_ = CONCAT31(local_60.ss_.ptr_._1_3_,1);
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.ss_.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>((internal *)local_40,"5","o",(int *)&local_60,&local_44);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if ((undefined8 *)local_40._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x50,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (((CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40._0_8_ = (Base *)0x0;
  ppBVar4 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                      (&((this->super_SharedPPDataTest).shared)->pmap,"test2",(Base **)local_40);
  if (*ppBVar4 == (Base *)0x0) {
    local_60.ss_.ptr_._0_4_ = CONCAT31(local_60.ss_.ptr_._1_3_,1);
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_44 = *(int *)&(*ppBVar4)[1]._vptr_Base;
    local_60.ss_.ptr_._0_4_ = (uint)local_60.ss_.ptr_._1_3_ << 8;
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_60,
               (AssertionResult *)"shared->GetProperty(\"test2\",o)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x51,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((Base *)local_40._0_8_ != (Base *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
    if (((local_68.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_68.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.ss_.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>((internal *)local_40,"5","o",(int *)&local_60,&local_44);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if ((undefined8 *)local_40._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x52,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (((CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pmVar1 = &((this->super_SharedPPDataTest).shared)->pmap;
  pBVar3 = (Base *)operator_new(0x10);
  pBVar3->_vptr_Base = (_func_int **)&PTR__Base_008dc138;
  *(undefined4 *)&pBVar3[1]._vptr_Base = 0x41400000;
  SetGenericPropertyPtr<Assimp::SharedPostProcessInfo::Base>(pmVar1,"test",pBVar3,(bool *)0x0);
  local_40._0_8_ = (Base *)0x0;
  ppBVar4 = GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                      (&((this->super_SharedPPDataTest).shared)->pmap,"test",(Base **)local_40);
  if (*ppBVar4 == (Base *)0x0) {
    local_60.ss_.ptr_._0_4_ = (uint)local_60.ss_.ptr_._1_3_ << 8;
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_60,
               (AssertionResult *)"shared->GetProperty(\"test\",m)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x56,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((Base *)local_40._0_8_ != (Base *)(local_40 + 0x10)) {
      operator_delete((void *)local_40._0_8_);
    }
    if (((local_68.data_ != (AssertHelperData *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_68.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  else {
    local_1c = *(float *)&(*ppBVar4)[1]._vptr_Base;
    local_60.ss_.ptr_._0_4_ = CONCAT31(local_60.ss_.ptr_._1_3_,1);
    local_58.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_60.ss_.ptr_._0_4_ = 0x41400000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_40,"12.f","m",(float *)&local_60,&local_1c);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message(&local_60);
    if ((undefined8 *)local_40._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utSharedPPData.cpp"
               ,0x57,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (((CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) != 0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((long *)CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_.ptr_._4_4_,(int)local_60.ss_.ptr_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(SharedPPDataTest, testPODProperty)
{
    int i = 5;
    shared->AddProperty("test",i);
	int o = 0;
    EXPECT_TRUE(shared->GetProperty("test",o));
    EXPECT_EQ(5, o);
    EXPECT_FALSE(shared->GetProperty("test2",o));
    EXPECT_EQ(5, o);

    float f = 12.f, m;
    shared->AddProperty("test",f);
    EXPECT_TRUE(shared->GetProperty("test",m));
    EXPECT_EQ(12.f, m);
}